

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

DelaySyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::DelaySyntax,slang::syntax::SyntaxKind&,slang::parsing::Token&,slang::syntax::ExpressionSyntax&>
          (BumpAllocator *this,SyntaxKind *args,Token *args_1,ExpressionSyntax *args_2)

{
  Token hash;
  DelaySyntax *this_00;
  
  this_00 = (DelaySyntax *)allocate(this,0x28,8);
  hash.kind = args_1->kind;
  hash._2_1_ = args_1->field_0x2;
  hash.numFlags.raw = (args_1->numFlags).raw;
  hash.rawLen = args_1->rawLen;
  hash.info = args_1->info;
  slang::syntax::DelaySyntax::DelaySyntax(this_00,*args,hash,args_2);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }